

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  equality_suite::run();
  relational_suite::run();
  operator_bool_suite::run();
  equal_to_suite::run();
  not_equal_to_suite::run();
  less_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    equality_suite::run();
    relational_suite::run();

    operator_bool_suite::run();

    equal_to_suite::run();
    not_equal_to_suite::run();
    less_suite::run();

    return boost::report_errors();
}